

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O0

void on_connect_without_close(uv_connect_t *req,int status)

{
  int status_local;
  uv_connect_t *req_local;
  
  if (status != -0x6f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x4f,"status == UV_ECONNREFUSED");
    abort();
  }
  connect_cb_calls = connect_cb_calls + 1;
  uv_timer_start(&timer,timer_cb,100,0);
  if (close_cb_calls != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x54,"close_cb_calls == 0");
    abort();
  }
  return;
}

Assistant:

static void on_connect_without_close(uv_connect_t *req, int status) {
  ASSERT(status == UV_ECONNREFUSED);
  connect_cb_calls++;

  uv_timer_start(&timer, timer_cb, 100, 0);

  ASSERT(close_cb_calls == 0);
}